

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

void __thiscall QFileDialogPrivate::emitUrlsSelected(QFileDialogPrivate *this,QList<QUrl> *files)

{
  bool bVar1;
  const_iterator o;
  ulong uVar2;
  QFileDialog *in_RSI;
  QFileDialogPrivate *in_RDI;
  long in_FS_OFFSET;
  QUrl *file;
  QList<QUrl> *__range1;
  QFileDialog *q;
  const_iterator __end1;
  const_iterator __begin1;
  QStringList localFiles;
  QStringList *in_stack_ffffffffffffff88;
  QFileDialog *in_stack_ffffffffffffff90;
  const_iterator local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  QFileDialog::urlsSelected(in_stack_ffffffffffffff90,(QList<QUrl> *)in_stack_ffffffffffffff88);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QList<QString>::QList((QList<QString> *)0x7509ac);
  local_28.i = (QUrl *)&DAT_aaaaaaaaaaaaaaaa;
  local_28 = QList<QUrl>::begin((QList<QUrl> *)in_RSI);
  o = QList<QUrl>::end((QList<QUrl> *)in_RSI);
  while (bVar1 = QList<QUrl>::const_iterator::operator!=(&local_28,o), bVar1) {
    in_stack_ffffffffffffff88 = (QStringList *)QList<QUrl>::const_iterator::operator*(&local_28);
    uVar2 = QUrl::isLocalFile();
    if ((uVar2 & 1) != 0) {
      QUrl::toLocalFile();
      QList<QString>::append((QList<QString> *)in_RSI,(rvalue_ref)in_stack_ffffffffffffff88);
      QString::~QString((QString *)0x750a6c);
    }
    QList<QUrl>::const_iterator::operator++(&local_28);
  }
  bVar1 = QList<QString>::isEmpty((QList<QString> *)0x750a84);
  if (!bVar1) {
    QFileDialog::filesSelected(in_RSI,in_stack_ffffffffffffff88);
  }
  QList<QString>::~QList((QList<QString> *)0x750aa1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFileDialogPrivate::emitUrlsSelected(const QList<QUrl> &files)
{
    Q_Q(QFileDialog);
    emit q->urlsSelected(files);
    QStringList localFiles;
    for (const QUrl &file : files)
        if (file.isLocalFile())
            localFiles.append(file.toLocalFile());
    if (!localFiles.isEmpty())
        emit q->filesSelected(localFiles);
}